

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Logger::Logger(Logger *this)

{
  LoggerClient *c;
  Logger *this_local;
  
  Environment::Environment(&this->super_Environment);
  (this->super_Environment).super_Counted._vptr_Counted = (_func_int **)&PTR__Logger_002ba610;
  LoggerStream::LoggerStream(&this->out_,this);
  LoggerStream::LoggerStream(&this->warn_,this);
  LoggerStream::LoggerStream(&this->err_,this);
  LoggerStream::LoggerStream(&this->status_,this);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->log_features_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->log_features_exclude_);
  this->log_everything_ = true;
  std::__cxx11::string::string((string *)&this->log_file_name_);
  std::__cxx11::string::string((string *)&this->current_feature_);
  this->current_feature_changed_ = false;
  std::
  set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::set(&this->clients_);
  this->quiet_ = true;
  this->pretty_ = true;
  this->minimal_ = false;
  this->notifying_error_ = false;
  c = (LoggerClient *)operator_new(0x10);
  ConsoleLogger::ConsoleLogger((ConsoleLogger *)c);
  register_client(this,c);
  return;
}

Assistant:

Logger::Logger() :
        out_(this),
        warn_(this),
        err_(this),
        status_(this),
        log_everything_(true),
        current_feature_changed_(false),
        quiet_(true),
        pretty_(true),
        minimal_(false),
	notifying_error_(false)
    {
        // Add a default client printing stuff to std::cout
        register_client(new ConsoleLogger());
#ifdef GEO_DEBUG
        quiet_ = false;
#endif        
    }